

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

TryEmplaceResult * __thiscall
QHash<QString,QVariant>::tryEmplace_impl<QLatin1String_const&>
          (TryEmplaceResult *__return_storage_ptr__,QHash<QString,QVariant> *this,QLatin1String *key
          )

{
  uchar uVar1;
  Span *pSVar2;
  storage_type *psVar3;
  char *__s;
  Bucket BVar4;
  Data<QHashPrivate::Node<QString,_QVariant>_> *pDVar5;
  size_t hash;
  Node<QString,_QVariant> *pNVar7;
  storage_type *psVar8;
  uint uVar10;
  long in_FS_OFFSET;
  QByteArrayView QVar11;
  Bucket BVar12;
  QHash<QString,_QVariant> local_60;
  Data *local_58;
  char16_t *pcStack_50;
  qsizetype local_48;
  long local_38;
  Span *pSVar6;
  ulong uVar9;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar5 = *(Data<QHashPrivate::Node<QString,_QVariant>_> **)this;
  if (pDVar5 == (Data<QHashPrivate::Node<QString,_QVariant>_> *)0x0) {
    pDVar5 = QHashPrivate::Data<QHashPrivate::Node<QString,_QVariant>_>::detached
                       ((Data<QHashPrivate::Node<QString,_QVariant>_> *)0x0);
    *(Data<QHashPrivate::Node<QString,_QVariant>_> **)this = pDVar5;
  }
  local_60.d = (Data *)0x0;
  hash = qHash(*key,pDVar5->seed);
  BVar12 = QHashPrivate::Data<QHashPrivate::Node<QString,_QVariant>_>::
           findBucketWithHash<QLatin1String>(pDVar5,key,hash);
  uVar9 = BVar12.index;
  pSVar6 = BVar12.span;
  uVar1 = pSVar6->offsets[uVar9];
  pDVar5 = *(Data<QHashPrivate::Node<QString,_QVariant>_> **)this;
  if ((pDVar5 == (Data<QHashPrivate::Node<QString,_QVariant>_> *)0x0) ||
     (1 < (uint)(pDVar5->ref).atomic._q_value.super___atomic_base<int>._M_i)) {
    QHash<QString,_QVariant>::operator=(&local_60,(QHash<QString,_QVariant> *)this);
    if (uVar1 == 0xff) {
LAB_001a7a51:
      pDVar5 = *(Data<QHashPrivate::Node<QString,_QVariant>_> **)this;
      if (pDVar5->numBuckets >> 1 <= pDVar5->size) {
        pDVar5 = QHashPrivate::Data<QHashPrivate::Node<QString,_QVariant>_>::detached
                           (pDVar5,pDVar5->size + 1);
        *(Data<QHashPrivate::Node<QString,_QVariant>_> **)this = pDVar5;
        BVar12 = QHashPrivate::Data<QHashPrivate::Node<QString,_QVariant>_>::
                 findBucketWithHash<QLatin1String>(pDVar5,key,hash);
        goto LAB_001a7ac8;
      }
    }
    else {
      pDVar5 = *(Data<QHashPrivate::Node<QString,_QVariant>_> **)this;
    }
    pSVar2 = pDVar5->spans;
    pDVar5 = QHashPrivate::Data<QHashPrivate::Node<QString,_QVariant>_>::detached(pDVar5);
    *(Data<QHashPrivate::Node<QString,_QVariant>_> **)this = pDVar5;
    uVar10 = (uint)BVar12.index & 0x7f;
    BVar4.index._0_4_ = uVar10;
    BVar4.span = pDVar5->spans +
                 ((((ulong)((long)pSVar6 - (long)pSVar2) >> 4) * 0x1c71c71c71c71c80 | uVar9) >> 7);
    BVar4.index._4_4_ = 0;
    BVar12.index._0_4_ = uVar10;
    BVar12.span = pDVar5->spans +
                  ((((ulong)((long)pSVar6 - (long)pSVar2) >> 4) * 0x1c71c71c71c71c80 | uVar9) >> 7);
    BVar12.index._4_4_ = 0;
    if (uVar1 != 0xff) goto LAB_001a7b4a;
  }
  else {
    BVar4 = BVar12;
    if (uVar1 != 0xff) goto LAB_001a7b4a;
    if (pDVar5->numBuckets >> 1 <= pDVar5->size) {
      QHash<QString,_QVariant>::operator=(&local_60,(QHash<QString,_QVariant> *)this);
      goto LAB_001a7a51;
    }
  }
LAB_001a7ac8:
  pNVar7 = QHashPrivate::Span<QHashPrivate::Node<QString,_QVariant>_>::insert
                     (BVar12.span,BVar12.index);
  psVar3 = (storage_type *)key->m_size;
  __s = key->m_data;
  psVar8 = (storage_type *)0x0;
  if (0 < (long)psVar3) {
    psVar8 = psVar3;
  }
  if (__s == (char *)0x0) {
    psVar8 = (storage_type *)0x0;
  }
  if (__s != (char *)0x0 && (long)psVar3 < 0) {
    psVar8 = (storage_type *)strlen(__s);
  }
  QVar11.m_data = psVar8;
  QVar11.m_size = (qsizetype)&local_58;
  QString::fromLatin1(QVar11);
  (pNVar7->key).d.d = local_58;
  (pNVar7->key).d.ptr = pcStack_50;
  (pNVar7->key).d.size = local_48;
  (pNVar7->value).d.data.shared = (PrivateShared *)0x0;
  *(undefined8 *)((long)&(pNVar7->value).d.data + 8) = 0;
  *(undefined8 *)((long)&(pNVar7->value).d.data + 0x10) = 0;
  *(undefined8 *)&(pNVar7->value).d.field_0x18 = 2;
  pDVar5 = *(Data<QHashPrivate::Node<QString,_QVariant>_> **)this;
  pDVar5->size = pDVar5->size + 1;
  BVar4 = BVar12;
LAB_001a7b4a:
  pSVar6 = pDVar5->spans;
  (__return_storage_ptr__->iterator).i.d = pDVar5;
  (__return_storage_ptr__->iterator).i.bucket =
       ((ulong)((long)BVar4.span - (long)pSVar6) >> 4) * 0x1c71c71c71c71c80 | BVar4.index;
  __return_storage_ptr__->inserted = uVar1 == 0xff;
  QHash<QString,_QVariant>::~QHash(&local_60);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

TryEmplaceResult tryEmplace_impl(K &&key, Args &&...args)
    {
        if (!d)
            detach();
        QHash detachGuard;

        size_t hash = QHashPrivate::calculateHash(key, d->seed);
        typename Data::Bucket bucket = d->findBucketWithHash(key, hash);
        const bool shouldInsert = bucket.isUnused();

        // Even if we don't insert we may have to detach because we are
        // returning a non-const iterator:
        if (!isDetached() || (shouldInsert && d->shouldGrow())) {
            detachGuard = *this;
            const bool resized = shouldInsert && d->shouldGrow();
            const size_t bucketIndex = bucket.toBucketIndex(d);

            // Must detach from detachGuard
            d = resized ? Data::detached(d, d->size + 1) : Data::detached(d);
            bucket = resized ? d->findBucketWithHash(key, hash) : typename Data::Bucket(d, bucketIndex);
        }
        if (shouldInsert) {
            Node *n = bucket.insert();
            using ConstructProxy = typename QHashPrivate::HeterogenousConstructProxy<Key, K>;
            Node::createInPlace(n, ConstructProxy(std::forward<K>(key)),
                                std::forward<Args>(args)...);
            ++d->size;
        }
        return {iterator(bucket.toIterator(d)), shouldInsert};
    }